

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cxx
# Opt level: O0

void __thiscall
glauber::Event::compute(Event *this,Nucleus *nucleusA,Nucleus *nucleusB,NucleonProfile *profile)

{
  long in_RDI;
  Event *in_stack_000000c0;
  Grid *in_stack_000000d8;
  NucleonProfile *in_stack_000000e0;
  Nucleus *in_stack_000000e8;
  Event *in_stack_000000f0;
  Event *in_stack_00000120;
  
  *(undefined4 *)(in_RDI + 0x198) = 0;
  compute_nuclear_thickness(in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,in_stack_000000d8)
  ;
  compute_nuclear_thickness(in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,in_stack_000000d8)
  ;
  compute_reduced_thickness(in_stack_000000c0);
  compute_observables(in_stack_00000120);
  return;
}

Assistant:

void Event::compute(const Nucleus& nucleusA, const Nucleus& nucleusB,
                    NucleonProfile& profile) {
  // Reset npart; compute_nuclear_thickness() increments it.
  npart_ = 0;
  compute_nuclear_thickness(nucleusA, profile, TA_);
  compute_nuclear_thickness(nucleusB, profile, TB_);
  compute_reduced_thickness();
  compute_observables();
}